

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgensubstruct.cpp
# Opt level: O0

void InitializeMatrices(TPZSubCompMesh *submesh,
                       TPZAutoPointer<TPZDohrSubstructCondense<double>_> *substruct,
                       TPZDohrAssembly<double> *dohrassembly)

{
  long lVar1;
  long lVar2;
  TPZAutoPointer<TPZMatrixSolver<double>_> *pTVar3;
  TPZBaseMatrix *pTVar4;
  TPZDohrSubstructCondense<double> *pTVar5;
  int64_t iVar6;
  TPZMatrix<double> *pTVar7;
  long *plVar8;
  double *pdVar9;
  int *piVar10;
  TPZMatRed<double,_TPZFMatrix<double>_> *this;
  TPZMatRed<double,_TPZFMatrix<double>_> *rval;
  TPZAutoPointer<TPZDohrSubstructCondense<double>_> *in_RSI;
  double extraout_XMM0_Qa;
  TPZMatRed<double,_TPZFMatrix<double>_> *matred2;
  TPZStepSolver<double> *InvertedInternalStiffness;
  TPZStepSolver<double> *InvertedStiffness;
  int64_t coarse;
  int64_t neq;
  int64_t ic;
  int64_t ncoarse;
  int64_t i;
  TPZAutoPointer<TPZMatrix<double>_> InternalStiffness;
  int64_t iel;
  TPZVec<long> invpermuteconnectscatter;
  TPZPairStructMatrix pairstructmatrix;
  TPZAutoPointer<TPZMatRed<double,_TPZVerySparseMatrix<double>_>_> matred;
  TPZMatRed<double,_TPZVerySparseMatrix<double>_> *matredptr;
  TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
  redstruct;
  TPZVec<long> permuteconnectscatter;
  TPZMatRed<double,_TPZFMatrix<double>_> *matredbig;
  TPZAutoPointer<TPZMatrix<double>_> Stiffness;
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_> skylstr;
  TPZVec<int> *permutescatter;
  pairnumbering fromsub;
  TPZMatRed<double,_TPZVerySparseMatrix<double>_> *in_stack_fffffffffffffae8;
  DecomposeType decomp;
  TPZSubCompMesh *in_stack_fffffffffffffaf0;
  TPZFMatrix<double> *in_stack_fffffffffffffaf8;
  TPZMatrix<double> *in_stack_fffffffffffffb00;
  TPZSubCompMesh *in_stack_fffffffffffffb08;
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_> *in_stack_fffffffffffffb10;
  TPZMatRed<double,_TPZFMatrix<double>_> *pTVar11;
  TPZFMatrix<double> *in_stack_fffffffffffffb18;
  TPZSubCompMesh *in_stack_fffffffffffffb20;
  TPZCompMesh *in_stack_fffffffffffffb28;
  TPZStepSolver<double> *in_stack_fffffffffffffb30;
  TPZMatRed<double,_TPZVerySparseMatrix<double>_> *in_stack_fffffffffffffb38;
  TPZMatRed<double,_TPZFMatrix<double>_> *in_stack_fffffffffffffb40;
  int64_t in_stack_fffffffffffffb70;
  int64_t in_stack_fffffffffffffb78;
  TPZMatRed<double,_TPZFMatrix<double>_> *in_stack_fffffffffffffb80;
  TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
  *in_stack_fffffffffffffc40;
  undefined1 local_308 [15];
  undefined1 local_2f9;
  TPZMatRed<double,_TPZFMatrix<double>_> *local_2f0;
  undefined1 local_2e0 [15];
  undefined1 local_2d1;
  TPZMatRed<double,_TPZFMatrix<double>_> *local_2c8;
  long local_2c0;
  int64_t local_2b8;
  long local_2b0;
  int64_t local_2a8;
  long local_2a0;
  long local_290;
  TPZVec<long> local_288 [2];
  undefined8 local_238;
  TPZVec<long> local_170;
  TPZAutoPointer<TPZMatrixSolver<double>_> *local_148;
  TPZAutoPointer<TPZMatrix<double>_> local_140 [3];
  TPZStructMatrix local_128;
  mapped_type *local_30;
  ENumbering local_28 [2];
  pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>
  local_20 [4];
  
  local_28[1] = 0;
  local_28[0] = InternalFirst;
  std::
  pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>::
  pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering,_true>
            (local_20,local_28 + 1,local_28);
  TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(in_RSI);
  local_30 = std::
             map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
             ::operator[]((map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
                           *)in_stack_fffffffffffffb30,(key_type *)in_stack_fffffffffffffb28);
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>::TPZStructMatrix
            (in_stack_fffffffffffffb10,&in_stack_fffffffffffffb08->super_TPZCompMesh);
  TPZStructMatrix::EquationFilter(&local_128);
  TPZEquationFilter::Reset((TPZEquationFilter *)in_stack_fffffffffffffaf0);
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>::Create
            ((TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_> *)in_stack_fffffffffffffb40
            );
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffb10,
             (TPZMatrix<double> *)in_stack_fffffffffffffb08);
  pTVar3 = (TPZAutoPointer<TPZMatrixSolver<double>_> *)operator_new(800);
  pTVar4 = &TPZAutoPointer<TPZMatrix<double>_>::operator->(local_140)->super_TPZBaseMatrix;
  TPZBaseMatrix::Rows(pTVar4);
  pTVar5 = TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(in_RSI);
  TPZVec<int>::NElements(&pTVar5->fCoarseNodes);
  pTVar4 = &TPZAutoPointer<TPZMatrix<double>_>::operator->(local_140)->super_TPZBaseMatrix;
  TPZBaseMatrix::Rows(pTVar4);
  TPZMatRed<double,_TPZFMatrix<double>_>::TPZMatRed
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  local_148 = pTVar3;
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffaf0,
             (TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffae8);
  TPZMatRed<double,_TPZFMatrix<double>_>::SetK00
            ((TPZMatRed<double,_TPZFMatrix<double>_> *)in_stack_fffffffffffffaf0,
             (TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffae8);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffaf0);
  TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(in_RSI);
  TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_>::operator=
            ((TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_> *)in_stack_fffffffffffffb10,
             (TPZMatRed<double,_TPZFMatrix<double>_> *)in_stack_fffffffffffffb08);
  TPZVec<long>::TPZVec(&local_170);
  iVar6 = TPZSubCompMesh::NumInternalEquations(in_stack_fffffffffffffb20);
  pTVar5 = TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(in_RSI);
  pTVar5->fNumInternalEquations = (int)iVar6;
  TPZSubCompMesh::PermuteInternalFirst
            (in_stack_fffffffffffffaf0,(TPZVec<long> *)in_stack_fffffffffffffae8);
  TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
  ::TPZMatRedStructMatrix
            ((TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
              *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  pTVar7 = TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
           ::Create(in_stack_fffffffffffffc40);
  if (pTVar7 == (TPZMatrix<double> *)0x0) {
    local_238 = 0;
  }
  else {
    local_238 = __dynamic_cast(pTVar7,&TPZMatrix<double>::typeinfo,
                               &TPZMatRed<double,TPZVerySparseMatrix<double>>::typeinfo,0);
  }
  TPZAutoPointer<TPZMatRed<double,_TPZVerySparseMatrix<double>_>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatRed<double,_TPZVerySparseMatrix<double>_>_> *)
             in_stack_fffffffffffffb10,
             (TPZMatRed<double,_TPZVerySparseMatrix<double>_> *)in_stack_fffffffffffffb08);
  TPZPairStructMatrix::TPZPairStructMatrix
            ((TPZPairStructMatrix *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
             (TPZVec<int> *)in_stack_fffffffffffffb20);
  TPZVec<long>::NElements(&local_170);
  TPZVec<long>::TPZVec((TPZVec<long> *)in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8)
  ;
  local_290 = 0;
  while( true ) {
    lVar1 = local_290;
    iVar6 = TPZVec<long>::NElements(&local_170);
    lVar2 = local_290;
    if (iVar6 <= lVar1) break;
    plVar8 = TPZVec<long>::operator[](&local_170,local_290);
    plVar8 = TPZVec<long>::operator[](local_288,*plVar8);
    *plVar8 = lVar2;
    local_290 = local_290 + 1;
  }
  TPZMatRed<double,_TPZVerySparseMatrix<double>_>::K00(in_stack_fffffffffffffae8);
  TPZCompMesh::Permute
            (&in_stack_fffffffffffffb20->super_TPZCompMesh,(TPZVec<long> *)in_stack_fffffffffffffb18
            );
  TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(in_RSI);
  pTVar4 = &TPZAutoPointer<TPZMatrix<double>_>::operator->(local_140)->super_TPZBaseMatrix;
  TPZBaseMatrix::Rows(pTVar4);
  TPZFMatrix<double>::Redim
            (in_stack_fffffffffffffb18,(int64_t)in_stack_fffffffffffffb10,
             (int64_t)in_stack_fffffffffffffb08);
  TPZAutoPointer<TPZMatrix<double>_>::operator->(local_140);
  TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(in_RSI);
  TPZPairStructMatrix::Assemble
            ((TPZPairStructMatrix *)in_stack_fffffffffffffb10,
             (TPZMatrix<double> *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
             in_stack_fffffffffffffaf8);
  TPZMatRed<double,_TPZFMatrix<double>_>::SimetrizeMatRed
            ((TPZMatRed<double,_TPZFMatrix<double>_> *)in_stack_fffffffffffffaf0);
  TPZMatRed<double,_TPZVerySparseMatrix<double>_>::SimetrizeMatRed
            ((TPZMatRed<double,_TPZVerySparseMatrix<double>_> *)in_stack_fffffffffffffaf0);
  TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(in_RSI);
  pTVar4 = &TPZAutoPointer<TPZMatrix<double>_>::operator->(local_140)->super_TPZBaseMatrix;
  TPZBaseMatrix::Rows(pTVar4);
  TPZManVector<double,_10>::Resize
            ((TPZManVector<double,_10> *)in_stack_fffffffffffffb20,
             (int64_t)in_stack_fffffffffffffb18);
  local_2a0 = 0;
  while( true ) {
    lVar1 = local_2a0;
    pTVar5 = TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(in_RSI);
    iVar6 = TPZVec<double>::NElements(&(pTVar5->fWeights).super_TPZVec<double>);
    if (iVar6 <= lVar1) break;
    pTVar7 = TPZAutoPointer<TPZMatrix<double>_>::operator->(local_140);
    (*(pTVar7->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(pTVar7,local_2a0);
    pTVar5 = TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(in_RSI);
    pdVar9 = TPZVec<double>::operator[](&(pTVar5->fWeights).super_TPZVec<double>,local_2a0);
    *pdVar9 = extraout_XMM0_Qa;
    local_2a0 = local_2a0 + 1;
  }
  pTVar5 = TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(in_RSI);
  local_2a8 = TPZVec<int>::NElements(&pTVar5->fCoarseNodes);
  pTVar4 = &TPZAutoPointer<TPZMatrix<double>_>::operator->(local_140)->super_TPZBaseMatrix;
  local_2b8 = TPZBaseMatrix::Rows(pTVar4);
  for (local_2b0 = 0; local_2b0 < local_2a8; local_2b0 = local_2b0 + 1) {
    pTVar5 = TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(in_RSI);
    piVar10 = TPZVec<int>::operator[](&pTVar5->fCoarseNodes,local_2b0);
    local_2c0 = (long)*piVar10;
    TPZAutoPointer<TPZMatrix<double>_>::operator->(local_140);
    in_stack_fffffffffffffb40 =
         (TPZMatRed<double,_TPZFMatrix<double>_> *)
         TPZMatrix<double>::operator()
                   ((TPZMatrix<double> *)in_stack_fffffffffffffb10,
                    (int64_t)in_stack_fffffffffffffb08,(int64_t)in_stack_fffffffffffffb00);
    (in_stack_fffffffffffffb40->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable =
         (_func_int **)
         ((double)(in_stack_fffffffffffffb40->super_TPZMatrix<double>).super_TPZBaseMatrix.
                  super_TPZSavable._vptr_TPZSavable + 10.0);
    in_stack_fffffffffffffb38 =
         (TPZMatRed<double,_TPZVerySparseMatrix<double>_> *)
         TPZMatrix<double>::operator()
                   ((TPZMatrix<double> *)in_stack_fffffffffffffb10,
                    (int64_t)in_stack_fffffffffffffb08,(int64_t)in_stack_fffffffffffffb00);
    (in_stack_fffffffffffffb38->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable = (_func_int **)0x3ff0000000000000;
    in_stack_fffffffffffffb30 =
         (TPZStepSolver<double> *)
         TPZMatrix<double>::operator()
                   ((TPZMatrix<double> *)in_stack_fffffffffffffb10,
                    (int64_t)in_stack_fffffffffffffb08,(int64_t)in_stack_fffffffffffffb00);
    (in_stack_fffffffffffffb30->super_TPZMatrixSolver<double>).super_TPZSolver.super_TPZSavable.
    _vptr_TPZSavable = (_func_int **)0x3ff0000000000000;
  }
  this = (TPZMatRed<double,_TPZFMatrix<double>_> *)operator_new(0x100);
  local_2d1 = 1;
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffaf0,
             (TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffae8);
  TPZStepSolver<double>::TPZStepSolver
            (in_stack_fffffffffffffb30,(TPZAutoPointer<TPZMatrix<double>_> *)this);
  local_2d1 = 0;
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffaf0);
  pTVar11 = this;
  local_2c8 = this;
  TPZAutoPointer<TPZBaseMatrix>::TPZAutoPointer<TPZMatrix<double>>
            ((TPZAutoPointer<TPZBaseMatrix> *)in_stack_fffffffffffffaf0,
             (TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffae8);
  (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (this,local_2e0);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer
            ((TPZAutoPointer<TPZBaseMatrix> *)in_stack_fffffffffffffaf0);
  TPZStepSolver<double>::SetDirect
            ((TPZStepSolver<double> *)in_stack_fffffffffffffaf0,
             (DecomposeType)((ulong)in_stack_fffffffffffffae8 >> 0x20));
  pTVar3 = local_148;
  TPZAutoPointer<TPZMatrixSolver<double>>::TPZAutoPointer<TPZStepSolver<double>>
            ((TPZAutoPointer<TPZMatrixSolver<double>_> *)in_stack_fffffffffffffb10,
             (TPZStepSolver<double> *)in_stack_fffffffffffffb08);
  TPZMatRed<double,_TPZFMatrix<double>_>::SetSolver(this,pTVar3);
  TPZAutoPointer<TPZMatrixSolver<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrixSolver<double>_> *)in_stack_fffffffffffffaf0);
  rval = (TPZMatRed<double,_TPZFMatrix<double>_> *)operator_new(0x100);
  local_2f9 = 1;
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffaf0,
             (TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffae8);
  TPZStepSolver<double>::TPZStepSolver
            (in_stack_fffffffffffffb30,(TPZAutoPointer<TPZMatrix<double>_> *)pTVar11);
  local_2f9 = 0;
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffaf0);
  pTVar11 = rval;
  local_2f0 = rval;
  TPZAutoPointer<TPZBaseMatrix>::TPZAutoPointer<TPZMatrix<double>>
            ((TPZAutoPointer<TPZBaseMatrix> *)in_stack_fffffffffffffaf0,
             (TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffae8);
  decomp = (DecomposeType)((ulong)in_stack_fffffffffffffae8 >> 0x20);
  (*(((TPZMatrixSolver<double> *)&rval->super_TPZMatrix<double>)->super_TPZSolver).super_TPZSavable.
    _vptr_TPZSavable[0xd])(rval,local_308);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer
            ((TPZAutoPointer<TPZBaseMatrix> *)in_stack_fffffffffffffaf0);
  TPZStepSolver<double>::SetDirect((TPZStepSolver<double> *)in_stack_fffffffffffffaf0,decomp);
  TPZAutoPointer<TPZMatrixSolver<double>>::TPZAutoPointer<TPZStepSolver<double>>
            ((TPZAutoPointer<TPZMatrixSolver<double>_> *)pTVar11,(TPZStepSolver<double> *)rval);
  TPZMatRed<double,_TPZVerySparseMatrix<double>_>::SetSolver
            ((TPZMatRed<double,_TPZVerySparseMatrix<double>_> *)this,pTVar3);
  TPZAutoPointer<TPZMatrixSolver<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrixSolver<double>_> *)in_stack_fffffffffffffaf0);
  TPZMatRed<double,_TPZVerySparseMatrix<double>_>::SetReduced
            ((TPZMatRed<double,_TPZVerySparseMatrix<double>_> *)in_stack_fffffffffffffaf0);
  operator_new(800);
  TPZMatRed<double,TPZFMatrix<double>>::TPZMatRed<TPZVerySparseMatrix<double>>
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  pTVar5 = TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(in_RSI);
  TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_>::operator=
            ((TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_> *)pTVar11,rval);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer((TPZAutoPointer<TPZMatrix<double>_> *)pTVar5);
  TPZVec<long>::~TPZVec((TPZVec<long> *)pTVar5);
  TPZPairStructMatrix::~TPZPairStructMatrix((TPZPairStructMatrix *)pTVar5);
  TPZAutoPointer<TPZMatRed<double,_TPZVerySparseMatrix<double>_>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatRed<double,_TPZVerySparseMatrix<double>_>_> *)pTVar5);
  TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
  ::~TPZMatRedStructMatrix
            ((TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
              *)pTVar5);
  TPZVec<long>::~TPZVec((TPZVec<long> *)pTVar5);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer((TPZAutoPointer<TPZMatrix<double>_> *)pTVar5);
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>::~TPZSkylineStructMatrix
            ((TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_> *)pTVar5);
  return;
}

Assistant:

void InitializeMatrices(TPZSubCompMesh *submesh, TPZAutoPointer<TPZDohrSubstructCondense<STATE> > substruct, TPZDohrAssembly<STATE> &dohrassembly)
{
	typedef TPZDohrSubstructCondense<STATE>::ENumbering ENumbering;
	typedef std::pair<ENumbering,ENumbering> pairnumbering;
	pairnumbering fromsub(TPZDohrSubstructCondense<STATE>::Submesh,TPZDohrSubstructCondense<STATE>::InternalFirst);
	TPZVec<int> &permutescatter = substruct->fPermutationsScatter[fromsub];
	
	// create a skyline matrix based on the current numbering of the mesh
	// put the stiffness matrix in a TPZMatRed object to facilitate the computation of phi and zi
	TPZSkylineStructMatrix<STATE> skylstr(submesh);
	skylstr.EquationFilter().Reset();
	
	TPZAutoPointer<TPZMatrix<STATE> > Stiffness = skylstr.Create();
	TPZMatRed<STATE,TPZFMatrix<STATE> > *matredbig = new TPZMatRed<STATE, TPZFMatrix<STATE> >(Stiffness->Rows()+substruct->fCoarseNodes.NElements(),Stiffness->Rows());
	matredbig->SetK00(Stiffness);
	substruct->fMatRedComplete = matredbig;
	
	
	TPZVec<int64_t> permuteconnectscatter;
	
	substruct->fNumInternalEquations = submesh->NumInternalEquations();
	// change the sequencing of the connects of the mesh, putting the internal connects first
	submesh->PermuteInternalFirst(permuteconnectscatter);
	
	// create a "substructure matrix" based on the submesh using a skyline matrix structure as the internal matrix
	TPZMatRedStructMatrix<TPZSkylineStructMatrix<STATE>,TPZVerySparseMatrix<STATE> > redstruct(submesh);
	TPZMatRed<STATE,TPZVerySparseMatrix<STATE> > *matredptr = dynamic_cast<TPZMatRed<STATE,TPZVerySparseMatrix<STATE> > *>(redstruct.Create());
	TPZAutoPointer<TPZMatRed<STATE,TPZVerySparseMatrix<STATE> > > matred = matredptr;
	
	// create a structural matrix which will assemble both stiffnesses simultaneously
	TPZPairStructMatrix pairstructmatrix(submesh,permutescatter);
	
	// reorder the sequence numbering of the connects to reflect the original ordering
	TPZVec<int64_t> invpermuteconnectscatter(permuteconnectscatter.NElements());
	int64_t iel;
	for (iel=0; iel < permuteconnectscatter.NElements(); iel++) {
		invpermuteconnectscatter[permuteconnectscatter[iel]] = iel;
	}
	TPZAutoPointer<TPZMatrix<STATE> > InternalStiffness = matredptr->K00();
	
	
	submesh->Permute(invpermuteconnectscatter);
	
	// compute both stiffness matrices simultaneously
	substruct->fLocalLoad.Redim(Stiffness->Rows(),1);
	pairstructmatrix.Assemble(Stiffness.operator->(), matredptr, substruct->fLocalLoad);
	matredbig->SimetrizeMatRed();
	matredptr->SimetrizeMatRed();
	
	substruct->fWeights.Resize(Stiffness->Rows());
	int64_t i;
	for(i=0; i<substruct->fWeights.NElements(); i++)
	{
		substruct->fWeights[i] = Stiffness->GetVal(i,i);
	}
	// Desingularize the matrix without affecting the solution
	int64_t ncoarse = substruct->fCoarseNodes.NElements(), ic;
	int64_t neq = Stiffness->Rows();
	for(ic=0; ic<ncoarse; ic++)
	{
		int64_t coarse = substruct->fCoarseNodes[ic];
		Stiffness->operator()(coarse,coarse) += 10.;
		matredbig->operator()(neq+ic,coarse) = 1.;
		matredbig->operator()(coarse,neq+ic) = 1.;
	}
	//substruct->fStiffness = Stiffness;
	TPZStepSolver<STATE> *InvertedStiffness = new TPZStepSolver<STATE>(Stiffness);
    InvertedStiffness->SetMatrix(Stiffness);
    InvertedStiffness->SetDirect(ECholesky);
	matredbig->SetSolver(InvertedStiffness);
	
	
	TPZStepSolver<STATE> *InvertedInternalStiffness = new TPZStepSolver<STATE>(InternalStiffness);
    InvertedInternalStiffness->SetMatrix(InternalStiffness);
    InvertedInternalStiffness->SetDirect(ECholesky);
	matredptr->SetSolver(InvertedInternalStiffness);
	matredptr->SetReduced();
	TPZMatRed<STATE,TPZFMatrix<STATE> > *matred2 = new TPZMatRed<STATE,TPZFMatrix<STATE> > (*matredptr);
	
	substruct->fMatRed = matred2;
}